

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O3

int doopen(int dx,int dy,int dz)

{
  undefined1 *puVar1;
  uint uVar2;
  monst *mtmp;
  byte bVar3;
  level *plVar4;
  boolean bVar5;
  int iVar6;
  undefined8 in_RAX;
  obj *pick;
  char x;
  char *pcVar7;
  byte y;
  uint uVar8;
  coord cc;
  schar unused;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (((youmonst.data)->mflags1 & 0x2000) != 0) {
    pcVar7 = "You can\'t open, close, or unlock anything -- you have no hands!";
    goto LAB_001b6f61;
  }
  if ((u.utrap != 0) && (u.utraptype == 1)) {
    pcVar7 = "You can\'t reach over the edge of the pit.";
    goto LAB_001b6f61;
  }
  if (dz == -2 || (dy == -2 || dx == -2)) {
LAB_001b6fc9:
    iVar6 = get_adjacent_loc((char *)0x0,(char *)0x0,u.ux,u.uy,(coord *)((long)&uStack_38 + 5),
                             (schar *)((long)&uStack_38 + 7));
    if (iVar6 == 0) {
      return 0;
    }
    dx = (int)uStack_38._5_1_ - (int)u.ux;
    dy = (int)(char)uStack_38._6_1_ - (int)u.uy;
    dz = 0;
    x = uStack_38._5_1_;
    y = uStack_38._6_1_;
  }
  else {
    x = u.ux + (char)dx;
    y = u.uy + (char)dy;
    uStack_38._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
    uStack_38._0_7_ = CONCAT16(y,CONCAT15(x,(int5)in_RAX));
    if (0x14 < y || (byte)(x + 0xb0U) < 0xb1) goto LAB_001b6fc9;
  }
  plVar4 = level;
  if (((char)(x - u.ux) == '\0') && (y == u.uy)) {
    return 0;
  }
  mtmp = level->monsters[x][(char)y];
  if ((((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) && (mtmp->m_ap_type == '\x01')) &&
     (((mtmp->mappearance == 0x1c || (mtmp->mappearance == 0x1b)) &&
      ((u.uprops[0x17].intrinsic == 0 && (u.uprops[0x17].extrinsic == 0)))))) {
    stumble_onto_mimic(mtmp,x - u.ux,y - u.uy);
    return 1;
  }
  if (level->locations[x][(char)y].typ == '\x17') {
    uVar2 = *(uint *)&level->locations[x][(char)y].field_0x6;
    uVar8 = uVar2 >> 4 & 0x1f;
    if (uVar8 == 2) {
      iVar6 = doclose(dx,dy,dz);
      return iVar6;
    }
    if ((uVar2 & 0x40) != 0) {
      if ((youmonst.data)->msize == '\0') {
        pcVar7 = "You\'re too small to pull the door open.";
        goto LAB_001b6f61;
      }
      pline("The door opens.");
      uVar2 = *(uint *)&plVar4->locations[x][(char)y].field_0x6;
      if ((uVar2 >> 8 & 1) == 0) {
        *(uint *)&plVar4->locations[x][(char)y].field_0x6 = uVar2 & 0xfffffe0f | 0x20;
      }
      else {
        b_trapped("door",3);
        puVar1 = &plVar4->locations[x][(char)y].field_0x6;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
        pcVar7 = in_rooms(level,uStack_38._5_1_,uStack_38._6_1_,0x12);
        if (*pcVar7 != '\0') {
          add_damage(uStack_38._5_1_,uStack_38._6_1_,0);
        }
      }
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b721b;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b7216;
LAB_001b7363:
        newsym((int)uStack_38._5_1_,(int)(char)uStack_38._6_1_);
      }
      else {
LAB_001b7216:
        if (ublindf != (obj *)0x0) {
LAB_001b721b:
          if (ublindf->oartifact == '\x1d') goto LAB_001b7363;
        }
        feel_location(uStack_38._5_1_,uStack_38._6_1_);
      }
      unblock_point((int)uStack_38._5_1_,(int)(char)uStack_38._6_1_);
      return 1;
    }
    bVar3 = 1;
    if (uVar8 == 2) {
      pcVar7 = " is already open";
    }
    else if (uVar8 == 1) {
      pcVar7 = " is broken";
    }
    else if (uVar8 == 0) {
      pcVar7 = "way has no door";
    }
    else {
      *(uint *)&level->locations[x][(char)y].field_0x6 = uVar2 | 1;
      map_background(x,y,1);
      pcVar7 = " is locked";
      bVar3 = 0;
    }
    pline("This door%s.",pcVar7);
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
        if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_001b72ad;
        goto LAB_001b7293;
      }
LAB_001b7298:
      if (ublindf->oartifact == '\x1d') goto LAB_001b72ad;
    }
    else {
LAB_001b7293:
      if (ublindf != (obj *)0x0) goto LAB_001b7298;
    }
    feel_location(uStack_38._5_1_,uStack_38._6_1_);
LAB_001b72ad:
    if ((bool)(bVar3 | flags.run != 0)) {
      return 0;
    }
    if (flags.autounlock != '\0') {
      pick = carrying(0xe2);
      if (((pick == (obj *)0x0) && (pick = carrying(0xe3), pick == (obj *)0x0)) &&
         (pick = carrying(0xe4), pick == (obj *)0x0)) {
        return 0;
      }
      iVar6 = pick_lock(pick,(int)uStack_38._5_1_,(int)(char)uStack_38._6_1_,'\x01','\0');
      return iVar6;
    }
    return 0;
  }
  bVar5 = is_db_wall((int)x,(int)(char)y);
  if (bVar5 != '\0') {
    pcVar7 = "There is no obvious way to open the drawbridge.";
LAB_001b6f61:
    pline(pcVar7);
    return 0;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        pcVar7 = "see";
        goto LAB_001b7196;
      }
      goto LAB_001b711d;
    }
  }
  else {
LAB_001b711d:
    if (ublindf == (obj *)0x0) {
      pcVar7 = "feel";
      goto LAB_001b7196;
    }
  }
  pcVar7 = "feel";
  if (ublindf->oartifact == '\x1d') {
    pcVar7 = "see";
  }
LAB_001b7196:
  pline("You %s no door there.",pcVar7);
  return 0;
}

Assistant:

int doopen(int dx, int dy, int dz)
{
	coord cc;
	struct rm *door;
	struct monst *mtmp;
	boolean got_dir = FALSE;
	schar unused;

	if (nohands(youmonst.data)) {
	    pline("You can't open, close, or unlock anything -- you have no hands!");
	    return 0;
	}

	if (u.utrap && u.utraptype == TT_PIT) {
	    pline("You can't reach over the edge of the pit.");
	    return 0;
	}
	
	if (dx != -2 && dy != -2 && dz != -2) { /* -2 signals no direction given  */
	    cc.x = u.ux + dx;
	    cc.y = u.uy + dy;
	    if (isok(cc.x, cc.y))
		got_dir = TRUE;
	}

	if (!got_dir && !get_adjacent_loc(NULL, NULL, u.ux, u.uy, &cc, &unused))
	    return 0;

        if (!got_dir) {
            dx = cc.x-u.ux;
            dy = cc.y-u.uy;
            dz = 0;
        }

	if ((cc.x == u.ux) && (cc.y == u.uy))
	    return 0;

	if ((mtmp = m_at(level, cc.x,cc.y))		&&
		mtmp->m_ap_type == M_AP_FURNITURE	&&
		(mtmp->mappearance == S_hcdoor ||
			mtmp->mappearance == S_vcdoor)	&&
		!Protection_from_shape_changers)	 {

	    stumble_onto_mimic(mtmp, cc.x-u.ux, cc.y-u.uy);
	    return 1;
	}

	door = &level->locations[cc.x][cc.y];

	if (!IS_DOOR(door->typ)) {
		if (is_db_wall(cc.x,cc.y)) {
		    pline("There is no obvious way to open the drawbridge.");
		    return 0;
		}
		pline("You %s no door there.",
				Blind ? "feel" : "see");
		return 0;
	}

        if (door->doormask == D_ISOPEN)
            return doclose(dx, dy, dz);

	if (!(door->doormask & D_CLOSED)) {
	    const char *mesg;
	    int locked = FALSE;

	    switch (door->doormask) {
	    case D_BROKEN: mesg = " is broken"; break;
	    case D_NODOOR: mesg = "way has no door"; break;
	    case D_ISOPEN: mesg = " is already open"; break;
	    default:
		door->mem_door_l = 1;
		map_background(cc.x, cc.y, TRUE);
		mesg = " is locked";
		locked = TRUE;
		break;
	    }
	    pline("This door%s.", mesg);
	    if (Blind) feel_location(cc.x,cc.y);
	    if (locked && !flags.run) {
		struct obj *otmp = NULL;
		if (flags.autounlock &&
		    ((otmp = carrying(SKELETON_KEY)) ||
		     (otmp = carrying(LOCK_PICK)) ||
		     (otmp = carrying(CREDIT_CARD))))
		    return pick_lock(otmp, cc.x, cc.y, TRUE, FALSE);
	    }
	    return 0;
	}

	if (verysmall(youmonst.data)) {
	    pline("You're too small to pull the door open.");
	    return 0;
	}

	/* door is known to be CLOSED */
	pline("The door opens.");
	if (door->doormask & D_TRAPPED) {
	    b_trapped("door", FINGER);
	    door->doormask = D_NODOOR;
	    if (*in_rooms(level, cc.x, cc.y, SHOPBASE)) add_damage(cc.x, cc.y, 0L);
	} else
	    door->doormask = D_ISOPEN;
	if (Blind)
	    feel_location(cc.x,cc.y);	/* the hero knows she opened it  */
	else
	    newsym(cc.x,cc.y);
	unblock_point(cc.x,cc.y);	/* vision: new see through there */

	return 1;
}